

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O3

char * glu::getApiTypeDescription(ApiType type)

{
  char *pcVar1;
  
  if ((int)type.m_bits < 0x113) {
    if ((int)type.m_bits < 0x23) {
      if (type.m_bits == 2) {
        return "OpenGL ES 2";
      }
      if (type.m_bits == 3) {
        return "OpenGL ES 3";
      }
      if (type.m_bits == 0x13) {
        return "OpenGL ES 3.1";
      }
    }
    else {
      if (type.m_bits == 0x23) {
        return "OpenGL ES 3.2";
      }
      if (type.m_bits == 0x103) {
        return "OpenGL 3.0 core";
      }
      if (type.m_bits == 0x104) {
        return "OpenGL 4.0 core";
      }
    }
  }
  else if ((int)type.m_bits < 0x124) {
    if (type.m_bits == 0x113) {
      return "OpenGL 3.1 core";
    }
    if (type.m_bits == 0x114) {
      return "OpenGL 4.1 core";
    }
    if (type.m_bits == 0x123) {
      return "OpenGL 3.2 core";
    }
  }
  else if ((int)type.m_bits < 0x134) {
    if (type.m_bits == 0x124) {
      return "OpenGL 4.2 core";
    }
    if (type.m_bits == 0x133) {
      return "OpenGL 3.3 core";
    }
  }
  else {
    if (type.m_bits == 0x134) {
      return "OpenGL 4.3 core";
    }
    if (type.m_bits == 0x144) {
      return "OpenGL 4.4 core";
    }
  }
  pcVar1 = (char *)0x0;
  if (type.m_bits == 0x154) {
    pcVar1 = "OpenGL 4.5 core";
  }
  return pcVar1;
}

Assistant:

const char* getApiTypeDescription (ApiType type)
{
	if (type == glu::ApiType::es(2, 0))			return "OpenGL ES 2";
	else if (type == glu::ApiType::es(3, 0))	return "OpenGL ES 3";
	else if (type == glu::ApiType::es(3, 1))	return "OpenGL ES 3.1";
	else if (type == glu::ApiType::es(3, 2))	return "OpenGL ES 3.2";
	else if (type == glu::ApiType::core(3, 0))	return "OpenGL 3.0 core";
	else if (type == glu::ApiType::core(3, 1))	return "OpenGL 3.1 core";
	else if (type == glu::ApiType::core(3, 2))	return "OpenGL 3.2 core";
	else if (type == glu::ApiType::core(3, 3))	return "OpenGL 3.3 core";
	else if (type == glu::ApiType::core(4, 0))	return "OpenGL 4.0 core";
	else if (type == glu::ApiType::core(4, 1))	return "OpenGL 4.1 core";
	else if (type == glu::ApiType::core(4, 2))	return "OpenGL 4.2 core";
	else if (type == glu::ApiType::core(4, 3))	return "OpenGL 4.3 core";
	else if (type == glu::ApiType::core(4, 4))	return "OpenGL 4.4 core";
	else if (type == glu::ApiType::core(4, 5))	return "OpenGL 4.5 core";
	else										return DE_NULL;
}